

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O1

int Cbs2_ManSolve2_rec(Cbs2_Man_t *p,int Level)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  int iVar4;
  Gia_Man_t *pGVar5;
  Gia_Obj_t *pGVar6;
  char *pcVar7;
  int *piVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  bool bVar19;
  int iDecLit2;
  int local_34;
  
  iVar11 = (p->pProp).iHead;
  if (iVar11 == (p->pProp).iTail) {
    __assert_fail("!Cbs2_QueIsEmpty(&p->pProp)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x523,"int Cbs2_ManSolve2_rec(Cbs2_Man_t *, int)");
  }
  iVar10 = Cbs2_ManPropagate2(p,Level);
  if (iVar10 == 0) {
    if ((p->pProp).iHead != (p->pProp).iTail) {
      __assert_fail("Cbs2_QueIsEmpty(&p->pProp)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                    ,0x527,"int Cbs2_ManSolve2_rec(Cbs2_Man_t *, int)");
    }
    iVar11 = Cbs2_ManUpdateFrontier(p,iVar11,&local_34);
    iVar10 = 0;
    if (iVar11 == 0) {
      iVar11 = (p->Pars).nBTThis;
      iVar14 = (p->Pars).nJustThis;
      iVar3 = (p->pJust).iTail;
      iVar4 = (p->pJust).iHead;
      iVar12 = iVar3 - iVar4;
      if (iVar14 <= iVar12) {
        iVar14 = iVar12;
      }
      (p->Pars).nJustThis = iVar14;
      bVar19 = (p->Pars).nJustLimit < iVar14;
      p->nFails[0] = p->nFails[0] + (uint)bVar19;
      bVar9 = (p->Pars).nBTLimit < iVar11;
      p->nFails[1] = p->nFails[1] + (uint)bVar9;
      if (!bVar9 && !bVar19) {
        if ((p->Pars).fUseHighest == 0) {
          __assert_fail("p->Pars.fUseHighest",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                        ,0x537,"int Cbs2_ManSolve2_rec(Cbs2_Man_t *, int)");
        }
        uVar18 = 0;
        if (iVar4 < iVar3) {
          lVar15 = 0;
          uVar18 = 0;
          do {
            uVar13 = (p->pJust).pData[iVar4 + lVar15];
            if (uVar13 == 0) break;
            uVar16 = uVar13;
            if ((int)uVar13 < (int)uVar18) {
              uVar16 = uVar18;
            }
            bVar19 = uVar18 == 0;
            uVar18 = uVar16;
            if (bVar19) {
              uVar18 = uVar13;
            }
            lVar15 = lVar15 + 1;
          } while (iVar12 != (int)lVar15);
        }
        if (-1 < (int)uVar18) {
          pGVar5 = p->pAig;
          if ((int)uVar18 < pGVar5->nObjs) {
            pGVar6 = pGVar5->pObjs;
            uVar13 = (uint)*(undefined8 *)(pGVar6 + uVar18);
            if ((-1 < (int)uVar13) && ((uVar13 & 0x1fffffff) != 0x1fffffff)) {
              uVar16 = uVar18 - (uVar13 & 0x1fffffff);
              if (((int)uVar16 < 0) || (iVar11 = (p->vAssign).nSize, iVar11 <= (int)uVar16)) {
LAB_0071758c:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                              ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
              }
              pcVar7 = (p->vAssign).pArray;
              if ('\x01' < pcVar7[uVar16]) {
                uVar16 = (uint)((ulong)*(undefined8 *)(pGVar6 + uVar18) >> 0x20);
                uVar17 = uVar18 - (uVar16 & 0x1fffffff);
                if (((int)uVar17 < 0) || (iVar11 <= (int)uVar17)) goto LAB_0071758c;
                if ('\x01' < pcVar7[uVar17]) {
                  pGVar1 = pGVar6 + ((ulong)uVar18 - (ulong)(uVar13 & 0x1fffffff));
                  if ((((pGVar1 < pGVar6) || (pGVar6 + pGVar5->nObjs <= pGVar1)) ||
                      (pGVar2 = pGVar6 + ((ulong)uVar18 - (ulong)(uVar16 & 0x1fffffff)),
                      pGVar2 < pGVar6)) || (pGVar6 + pGVar5->nObjs <= pGVar2)) {
                    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
                  }
                  iVar11 = (p->pProp).iHead;
                  if (pGVar5->pRefs[(int)((ulong)((long)pGVar2 - (long)pGVar6) >> 2) * -0x55555555]
                      < pGVar5->pRefs
                        [(int)((ulong)((long)pGVar1 - (long)pGVar6) >> 2) * -0x55555555]) {
                    uVar16 = uVar13;
                  }
                  iVar10 = uVar18 - (uVar16 & 0x1fffffff);
                  if (iVar10 < 0) {
                    __assert_fail("Var >= 0 && !(c >> 1)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                  ,0x12e,"int Abc_Var2Lit(int, int)");
                  }
                  uVar18 = (uVar16 >> 0x1d & 1) + iVar10 * 2;
                  iVar12 = Level + 1;
                  Cbs2_ManAssign(p,uVar18 ^ 1,iVar12,0,0);
                  iVar14 = Cbs2_ManSolve2_rec(p,iVar12);
                  if (iVar14 == 0) {
                    return 0;
                  }
                  if ((p->pClauses).pData[(long)iVar14 + 1] != iVar10) {
                    return iVar14;
                  }
                  Cbs2_ManCancelUntil(p,iVar11);
                  (p->pJust).iHead = iVar4;
                  (p->pJust).iTail = iVar3;
                  Cbs2_ManAssign(p,uVar18,iVar12,0,0);
                  iVar11 = Cbs2_ManSolve2_rec(p,iVar12);
                  if (iVar11 == 0) {
                    return 0;
                  }
                  piVar8 = (p->pClauses).pData;
                  if (piVar8[(long)iVar11 + 1] != iVar10) {
                    return iVar11;
                  }
                  iVar11 = Cbs2_ManResolve(p,iVar14,iVar11,(int)piVar8);
                  if ((p->pClauses).iHead == (p->pClauses).iTail) {
                    piVar8 = &(p->Pars).nBTThis;
                    *piVar8 = *piVar8 + 1;
                    return iVar11;
                  }
                  __assert_fail("Cbs2_QueIsEmpty( &p->pClauses )",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                                ,0x270,"void Cbs2_ManBumpClause(Cbs2_Man_t *, int)");
                }
              }
            }
            __assert_fail("Cbs2_VarIsJust(p, pVar, iVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                          ,0x53a,"int Cbs2_ManSolve2_rec(Cbs2_Man_t *, int)");
          }
        }
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
    }
  }
  return iVar10;
}

Assistant:

int Cbs2_ManSolve2_rec( Cbs2_Man_t * p, int Level )
{ 
    Gia_Obj_t * pVar;
    Cbs2_Que_t * pQue = &(p->pClauses);
    int iPropHead, iJustHead, iJustTail;
    int hClause, hLearn0, hLearn1, iVar, iDecLit, iDecLit2;
    int iPropHeadOld = p->pProp.iHead;
    // propagate assignments
    assert( !Cbs2_QueIsEmpty(&p->pProp) );
    if ( (hClause = Cbs2_ManPropagate2( p, Level )) )
        return hClause;
    // check for satisfying assignment
    assert( Cbs2_QueIsEmpty(&p->pProp) );
//    if ( Cbs2_QueIsEmpty(&p->pJust) )
//        return 0;
    if ( Cbs2_ManUpdateFrontier(p, iPropHeadOld, &iDecLit2) )
        return 0;
    // quit using resource limits
    p->Pars.nJustThis = Abc_MaxInt( p->Pars.nJustThis, p->pJust.iTail - p->pJust.iHead );
    if ( Cbs2_ManCheckLimits( p ) )
        return 0;
    // remember the state before branching
    iPropHead = p->pProp.iHead;
//    Cbs2_QueStore( &p->pJust, &iJustHead, &iJustTail );
    iJustHead = p->pJust.iHead;
    iJustTail = p->pJust.iTail;
    // find the decision variable

    assert( p->Pars.fUseHighest );
    iVar = Cbs2_ManDecideHighest( p );
    pVar = Gia_ManObj( p->pAig, iVar );
    assert( Cbs2_VarIsJust(p, pVar, iVar) );
    // chose decision variable using fanout count
    if ( Gia_ObjRefNum(p->pAig, Gia_ObjFanin0(pVar)) > Gia_ObjRefNum(p->pAig, Gia_ObjFanin1(pVar)) )
//    if ( Vec_IntEntry(&p->vActivity, Gia_ObjFaninId0(pVar, iVar)) > Vec_IntEntry(&p->vActivity, Gia_ObjFaninId1(pVar, iVar)) )
        iDecLit = Abc_LitNot(Gia_ObjFaninLit0(pVar, iVar));
    else
        iDecLit = Abc_LitNot(Gia_ObjFaninLit1(pVar, iVar));

    //iDecLit = iDecLit2;

    // decide on first fanin
    Cbs2_ManAssign( p, iDecLit, Level+1, 0, 0 );
    if ( !(hLearn0 = Cbs2_ManSolve2_rec( p, Level+1 )) )
        return 0;
    if ( pQue->pData[hLearn0+1] != Abc_Lit2Var(iDecLit) )
        return hLearn0;
    Cbs2_ManCancelUntil( p, iPropHead );
    Cbs2_QueRestore( &p->pJust, iJustHead, iJustTail );
    // decide on second fanin
    Cbs2_ManAssign( p, Abc_LitNot(iDecLit), Level+1, 0, 0 );
    if ( !(hLearn1 = Cbs2_ManSolve2_rec( p, Level+1 )) )
        return 0;
    if ( pQue->pData[hLearn1+1] != Abc_Lit2Var(iDecLit) )
        return hLearn1;
    hClause = Cbs2_ManResolve( p, Level, hLearn0, hLearn1 );
    Cbs2_ManBumpClause( p, hClause );
    //Cbs2_ManPrintCube( p, Level, hClause );
//    if ( Level > Cbs2_ClauseDecLevel(p, hClause) )
//        p->Pars.nBTThisNc++;
    p->Pars.nBTThis++;
    return hClause;
}